

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O0

Integer ma_table_allocate(TableData data)

{
  Table __dest;
  char *emsg;
  TableData in_RDI;
  Integer slots_examined;
  Integer i;
  uint new_ma_table_size;
  Integer new_ma_table_capacity;
  Table new_ma_table;
  long local_38;
  char *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  long in_stack_ffffffffffffffe0;
  long lVar1;
  
  if (ma_table_capacity <= ma_table_entries) {
    if (ma_table_capacity == 0) {
      lVar1 = 0x20;
    }
    else {
      lVar1 = ma_table_capacity << 1;
    }
    in_stack_ffffffffffffffdc = (uint)(lVar1 << 4);
    __dest = (Table)malloc(lVar1 << 4 & 0xffffffff);
    if (__dest == (Table)0x0) {
      sprintf(ma_ebuf,"could not allocate %u bytes for ma_table",(ulong)in_stack_ffffffffffffffdc);
      ma_error((ErrorLevel)((ulong)lVar1 >> 0x20),(ErrorType)lVar1,
               (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               in_stack_ffffffffffffffd0);
      return -1;
    }
    in_stack_ffffffffffffffe0 = lVar1;
    if (0 < ma_table_capacity) {
      memcpy(__dest,ma_table,(long)(int)(ma_table_capacity << 4));
      free(ma_table);
      in_stack_ffffffffffffffe0 = lVar1;
    }
    while (lVar1 = lVar1 + -1, ma_table_capacity <= lVar1) {
      __dest[lVar1].state = TES_Unused;
    }
    ma_table_next_slot = ma_table_capacity;
    ma_table_capacity = in_stack_ffffffffffffffe0;
    ma_table = __dest;
  }
  local_38 = 0;
  emsg = (char *)ma_table_next_slot;
  while( true ) {
    if (ma_table_capacity <= local_38) {
      sprintf(ma_ebuf,"no ma_table slot available, %ld/%ld slots used",ma_table_entries,
              ma_table_capacity);
      ma_error((ErrorLevel)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
               (ErrorType)in_stack_ffffffffffffffe0,
               (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),emsg);
      return -1;
    }
    if (ma_table[(long)emsg].state != TES_Allocated) break;
    local_38 = local_38 + 1;
    emsg = (char *)((long)(emsg + 1) % ma_table_capacity);
  }
  ma_table[(long)emsg].data = in_RDI;
  ma_table[(long)emsg].state = TES_Allocated;
  ma_table_entries = ma_table_entries + 1;
  ma_table_next_slot = (long)(emsg + 1) % ma_table_capacity;
  return (Integer)emsg;
}

Assistant:

public Integer ma_table_allocate(data)
    TableData    data;        /* to store */
{
    Table    new_ma_table;
    Integer    new_ma_table_capacity;
    unsigned    new_ma_table_size;
    Integer    i;
    Integer    slots_examined;

    /* expand the table if necessary */
    if (ma_table_entries >= ma_table_capacity)
    {
        /* increase table capacity */
        if (ma_table_capacity == 0)
            /* set the initial capacity */
            new_ma_table_capacity = DEFAULT_TABLE_ENTRIES;
        else
            /* double the current capacity */
            new_ma_table_capacity = 2 * ma_table_capacity;

        /* allocate space for new table */
        new_ma_table_size = (unsigned)(new_ma_table_capacity * sizeof(TableEntry));
        if ((new_ma_table = (Table)bytealloc(new_ma_table_size)) == (Table)NULL)
        {
            (void)sprintf(ma_ebuf,
                "could not allocate %u bytes for ma_table",
                new_ma_table_size);
            ma_error(EL_Nonfatal, ET_Internal, "ma_table_allocate", ma_ebuf);
            return TABLE_HANDLE_NONE;
        }

        /* copy and free old table */
        if (ma_table_capacity > 0)
        {
            bytecopy(ma_table, new_ma_table, (ma_table_capacity * sizeof(TableEntry)));
            bytefree(ma_table);
        }

        /* initialize new part of new table */
        for (i = new_ma_table_capacity-1; i >= ma_table_capacity; i--)
            new_ma_table[i].state = TES_Unused;

        /* remember the new table */
        ma_table = new_ma_table;
        ma_table_next_slot = ma_table_capacity;
        ma_table_capacity = new_ma_table_capacity;
    }

    /* perform a linear circular search to find the next available slot */
    for (slots_examined = 0, i = ma_table_next_slot;
         slots_examined < ma_table_capacity;
         slots_examined++, i = (i+1) % ma_table_capacity)
    {
        if (ma_table[i].state != TES_Allocated)
        {
            /* store the data */
            ma_table[i].data = data;
            ma_table[i].state = TES_Allocated;

            /* increment ma_table_entries */
            ma_table_entries++;

            /* advance ma_table_next_slot */
            ma_table_next_slot = (i+1) % ma_table_capacity;

            /* return the handle */
            return i;
        }
    }

    /* if we get here, something is wrong */
    (void)sprintf(ma_ebuf,
        "no ma_table slot available, %ld/%ld slots used",
        (long)ma_table_entries, (long)ma_table_capacity);
    ma_error(EL_Nonfatal, ET_Internal, "ma_table_allocate", ma_ebuf);
    return TABLE_HANDLE_NONE;
}